

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O0

void * embree::alignedMalloc(size_t size,size_t align)

{
  int iVar1;
  undefined8 uVar2;
  ulong in_RSI;
  size_t in_RDI;
  void *ptr;
  bad_alloc *this;
  bad_alloc *local_28;
  bad_alloc *local_20;
  size_t local_18;
  bad_alloc *local_8;
  
  if (in_RDI == 0) {
    local_28 = (bad_alloc *)0x0;
  }
  else {
    local_18 = in_RSI;
    if (in_RSI == 1) {
      local_8 = (bad_alloc *)malloc(in_RDI);
    }
    else {
      if (((in_RSI & in_RSI - 1) == 0) && (in_RSI < 8)) {
        local_18 = 8;
      }
      iVar1 = posix_memalign(&local_20,local_18,in_RDI);
      if (iVar1 == 0) {
        local_8 = local_20;
      }
      else {
        local_8 = (bad_alloc *)0x0;
      }
    }
    if ((in_RDI != 0) && (local_8 == (bad_alloc *)0x0)) {
      this = local_8;
      uVar2 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this);
      __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_28 = local_8;
  }
  return local_28;
}

Assistant:

void* alignedMalloc(size_t size, size_t align)
  {
    if (size == 0)
      return nullptr;

    assert((align & (align-1)) == 0);
    void* ptr = _mm_malloc(size,align);
    if (size != 0 && ptr == nullptr)
      throw std::bad_alloc();
    return ptr;
  }